

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffgtclll(fitsfile *fptr,int colnum,int *typecode,LONGLONG *repeat,LONGLONG *width,int *status)

{
  tcolumn *ptVar1;
  int iVar2;
  LONGLONG LVar3;
  int hdutype;
  int decims;
  long tmpwidth;
  int local_40;
  int local_3c;
  LONGLONG local_38;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2))
    goto LAB_0017fe68;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
    *status = 0x12e;
    return 0x12e;
  }
  ptVar1 = fptr->Fptr->tableptr;
  iVar2 = ffghdt(fptr,&local_40,status);
  if (iVar2 < 1) {
    if (local_40 == 1) {
      ffasfm(ptVar1[(ulong)(uint)colnum - 1].tform,typecode,&local_38,&local_3c,status);
      *width = local_38;
      LVar3 = 1;
      if (repeat == (LONGLONG *)0x0) goto LAB_0017fe68;
    }
    else {
      if (typecode != (int *)0x0) {
        *typecode = ptVar1[(ulong)(uint)colnum - 1].tdatatype;
      }
      if (width != (LONGLONG *)0x0) {
        *width = ptVar1[(ulong)(uint)colnum - 1].twidth;
      }
      if (repeat == (LONGLONG *)0x0) goto LAB_0017fe68;
      LVar3 = ptVar1[(ulong)(uint)colnum - 1].trepeat;
    }
    *repeat = LVar3;
  }
LAB_0017fe68:
  return *status;
}

Assistant:

int ffgtclll( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,       /* I - column number                           */
            int *typecode,   /* O - datatype code (21 = short, etc)         */
            LONGLONG *repeat, /* O - repeat count of field                   */
            LONGLONG *width, /* O - if ASCII, width of field or unit string */
            int  *status)    /* IO - error status                           */
/*
  Get Type of table column. 
  Returns the datatype code of the column, as well as the vector
  repeat count and (if it is an ASCII character column) the
  width of the field or a unit string within the field.  This supports the
  TFORMn = 'rAw' syntax for specifying arrays of substrings, so
  if TFORMn = '60A12' then repeat = 60 and width = 12.
*/
{
    tcolumn *colptr;
    int hdutype, decims;
    long tmpwidth;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += (colnum - 1);    /* offset to correct column */

    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == ASCII_TBL)
    {
       ffasfm(colptr->tform, typecode, &tmpwidth, &decims, status);
       *width = tmpwidth;
       
      if (repeat)
           *repeat = 1;
    }
    else
    {
      if (typecode)
          *typecode = colptr->tdatatype;

      if (width)
          *width = colptr->twidth;

      if (repeat)
          *repeat = colptr->trepeat;
    }

    return(*status);
}